

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

Buffer * __thiscall rcg::Stream::grab(Stream *this,int64_t _timeout)

{
  DS_HANDLE pvVar1;
  PDSQueueBuffer p_Var2;
  int iVar3;
  GC_ERROR GVar4;
  uint uVar5;
  void *pvVar6;
  GenTLException *pGVar7;
  uint64_t uVar8;
  EVENT_NEW_BUFFER_DATA data;
  size_t size;
  string local_68;
  void *local_48;
  undefined8 uStack_40;
  size_t local_38;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 == 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < _timeout) {
      uVar8 = _timeout;
    }
    if ((this->bn == 0) || (this->event == (void *)0x0)) {
      pGVar7 = (GenTLException *)__cxa_allocate_exception(0x28);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Streaming::grab(): Streaming not started","");
      GenTLException::GenTLException(pGVar7,&local_68);
      __cxa_throw(pGVar7,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    _timeout = (int64_t)&this->buffer;
    pvVar6 = Buffer::getHandle((Buffer *)_timeout);
    if (pvVar6 != (void *)0x0) {
      pvVar1 = this->stream;
      p_Var2 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               DSQueueBuffer;
      pvVar6 = Buffer::getHandle((Buffer *)_timeout);
      GVar4 = (*p_Var2)(pvVar1,pvVar6);
      if (GVar4 != 0) goto LAB_0011243c;
      Buffer::setHandle((Buffer *)_timeout,(void *)0x0);
    }
    local_38 = 0x10;
    local_48 = (void *)0x0;
    uStack_40 = 0;
    uVar5 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->EventGetData)(this->event,&local_48,&local_38,uVar8);
    if ((uVar5 & 0xfffffffe) == 0xfffffc0c) {
      _timeout = 0;
    }
    else {
      if (uVar5 != 0) {
        pGVar7 = (GenTLException *)__cxa_allocate_exception(0x28);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Stream::grab()","");
        GenTLException::GenTLException(pGVar7,&local_68,&this->gentl);
        __cxa_throw(pGVar7,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      Buffer::setHandle((Buffer *)_timeout,local_48);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return (Buffer *)_timeout;
  }
  std::__throw_system_error(iVar3);
LAB_0011243c:
  Buffer::setHandle((Buffer *)_timeout,(void *)0x0);
  pGVar7 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Stream::grab()","");
  GenTLException::GenTLException(pGVar7,&local_68,&this->gentl);
  __cxa_throw(pGVar7,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

const Buffer *Stream::grab(int64_t _timeout)
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  uint64_t timeout=GENTL_INFINITE;
  if (_timeout >= 0)
  {
    timeout=static_cast<uint64_t>(_timeout);
  }

  // check that streaming had been started

  if (bn == 0 || event == 0)
  {
    throw GenTLException("Streaming::grab(): Streaming not started");
  }

  // enqueue previously delivered buffer if any

  if (buffer.getHandle() != 0)
  {
    if (gentl->DSQueueBuffer(stream, buffer.getHandle()) != GenTL::GC_ERR_SUCCESS)
    {
      buffer.setHandle(0);
      throw GenTLException("Stream::grab()", gentl);
    }

    buffer.setHandle(0);
  }

  // wait for event

  GenTL::EVENT_NEW_BUFFER_DATA data;
  size_t size=sizeof(GenTL::EVENT_NEW_BUFFER_DATA);
  memset(&data, 0, size);

  GenTL::GC_ERROR err=gentl->EventGetData(event, &data, &size, timeout);

  // return 0 in case of abort and timeout and throw exception in case of
  // another error

  if (err == GenTL::GC_ERR_ABORT || err == GenTL::GC_ERR_TIMEOUT)
  {
    return 0;
  }
  else if (err != GenTL::GC_ERR_SUCCESS)
  {
    throw GenTLException("Stream::grab()", gentl);
  }

  // return buffer

  buffer.setHandle(data.BufferHandle);

  return &buffer;
}